

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O3

bool __thiscall
ASDCP::MXF::FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_>::Unarchive
          (FixedSizeItemCollection<ASDCP::MXF::PushSet<Kumu::UUID>_> *this,MemIOReader *Reader)

{
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  UUID local_50;
  
  uVar8 = Reader->m_size;
  if ((ulong)uVar8 + 4 <= (ulong)Reader->m_capacity) {
    uVar1 = *(uint *)(Reader->m_p + uVar8);
    uVar7 = uVar8 + 4;
    Reader->m_size = uVar7;
    if ((ulong)uVar7 + 4 <= (ulong)Reader->m_capacity) {
      iVar2 = *(int *)(Reader->m_p + uVar7);
      bVar5 = iVar2 == 0x10000000 || uVar1 == 0;
      Reader->m_size = uVar8 + 8;
      if (uVar1 == 0) {
        return bVar5;
      }
      if (iVar2 != 0x10000000) {
        return bVar5;
      }
      uVar8 = 1;
      while( true ) {
        local_50.super_Identifier<16U>.super_IArchive._vptr_IArchive =
             (_func_int **)&PTR__IArchive_00222020;
        uVar7 = Reader->m_capacity;
        uVar6 = Reader->m_size + 0x10;
        if (uVar7 < uVar6) break;
        uVar3 = *(undefined8 *)(Reader->m_p + Reader->m_size);
        uVar4 = *(undefined8 *)(Reader->m_p + Reader->m_size + 8);
        local_50.super_Identifier<16U>.m_Value._0_7_ = SUB87(uVar3,0);
        local_50.super_Identifier<16U>.m_Value[7] = (byte_t)((ulong)uVar3 >> 0x38);
        local_50.super_Identifier<16U>.m_Value._8_7_ = SUB87(uVar4,0);
        local_50.super_Identifier<16U>.m_Value[0xf] = (byte_t)((ulong)uVar4 >> 0x38);
        Reader->m_size = uVar6;
        local_50.super_Identifier<16U>.m_HasValue = true;
        std::
        _Rb_tree<Kumu::UUID,Kumu::UUID,std::_Identity<Kumu::UUID>,std::less<Kumu::UUID>,std::allocator<Kumu::UUID>>
        ::_M_insert_unique<Kumu::UUID_const&>
                  ((_Rb_tree<Kumu::UUID,Kumu::UUID,std::_Identity<Kumu::UUID>,std::less<Kumu::UUID>,std::allocator<Kumu::UUID>>
                    *)&(this->super_PushSet<Kumu::UUID>).
                       super_set<Kumu::UUID,_std::less<Kumu::UUID>,_std::allocator<Kumu::UUID>_>,
                   &local_50);
        if (uVar7 < uVar6) {
          return true;
        }
        bVar5 = (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18) <=
                uVar8;
        uVar8 = uVar8 + 1;
        if (bVar5) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool Unarchive(Kumu::MemIOReader* Reader) {
	    ui32_t item_count, item_size;
	    if ( ! Reader->ReadUi32BE(&item_count) ) return false;
	    if ( ! Reader->ReadUi32BE(&item_size) ) return false;

	    if ( item_count > 0 )
	      {
		if ( this->ItemSize() != item_size ) return false;
	      }

	    bool result = true;
	    for ( ui32_t i = 0; i < item_count && result; ++i )
	      {
		typename ContainerType::value_type tmp_item;
		result = tmp_item.Unarchive(Reader);

		if ( result )
		  {
		    this->push_back(tmp_item);
		  }
	      }

	    return result;
	  }